

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeekstat.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  uint *__base;
  size_t __nmemb;
  ulong uVar6;
  long lVar7;
  undefined8 uStack_50;
  uint auStack_48 [4];
  int local_38;
  int32_t a;
  int cnum;
  int32_t b;
  
  uStack_50 = 0x101387;
  iVar3 = nva_init();
  if (iVar3 == 0) {
    local_38 = 0;
    do {
      while( true ) {
        uStack_50 = 0x1013bc;
        iVar3 = getopt(argc,argv,"c:");
        if (iVar3 != 99) break;
        uStack_50 = 0x1013d9;
        __isoc99_sscanf(_optarg,"%d",&local_38);
      }
    } while (iVar3 != -1);
    if (local_38 < nva_cardsnum) {
      a = 10000;
      if (_optind < argc) {
        uStack_50 = 0x10141d;
        __isoc99_sscanf(argv[_optind],"%x",auStack_48 + 3);
        if (_optind + 1 < argc) {
          uStack_50 = 0x10143f;
          __isoc99_sscanf(argv[(long)_optind + 1],"%d",&a);
        }
        lVar2 = -((ulong)(uint)a * 4 + 0xf & 0xfffffffffffffff0);
        __base = (uint *)((long)auStack_48 + lVar2);
        __nmemb = (size_t)a;
        if (0 < (long)__nmemb) {
          pvVar1 = nva_cards[local_38].bar0;
          sVar4 = 0;
          do {
            __base[sVar4] = *(uint *)((long)pvVar1 + (ulong)auStack_48[3]);
            sVar4 = sVar4 + 1;
          } while (__nmemb != sVar4);
        }
        *(undefined8 *)((long)auStack_48 + lVar2 + -8) = 0x1014a1;
        qsort(__base,__nmemb,4,cmp);
        uVar6 = (ulong)*__base;
        if (a < 1) {
          uVar5 = 0;
        }
        else {
          lVar7 = 0;
          uVar5 = 0;
          do {
            if (__base[lVar7] != (uint)uVar6) {
              *(undefined8 *)((long)auStack_48 + lVar2 + -8) = 0x1014c8;
              printf("%08x: %d\n",uVar6,uVar5);
              uVar6 = (ulong)__base[lVar7];
              uVar5 = 0;
            }
            uVar5 = (ulong)((int)uVar5 + 1);
            lVar7 = lVar7 + 1;
          } while (lVar7 < a);
        }
        *(undefined8 *)((long)auStack_48 + lVar2 + -8) = 0x1014ee;
        printf("%08x: %d\n",uVar6,uVar5);
        return 0;
      }
      uStack_50 = 0x101524;
      main_cold_4();
    }
    else if (nva_cardsnum == 0) {
      uStack_50 = 0x10151d;
      main_cold_3();
    }
    else {
      uStack_50 = 0x10152b;
      main_cold_2();
    }
  }
  else {
    uStack_50 = 0x101508;
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 10000, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%d", &b);
	uint32_t tab[b];
	for (i = 0; i < b; i++)
		tab[i] = nva_rd32(cnum, a);
	qsort(tab, b, sizeof *tab, cmp);
	uint32_t prev = tab[0];
	int cnt = 0;
	for (i = 0; i < b; i++) {
		if (tab[i] != prev) {
			printf("%08x: %d\n", prev, cnt);
			cnt = 0;
			prev = tab[i];
		}
		cnt++;
	}
	printf("%08x: %d\n", prev, cnt);
	return 0;
}